

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

void byte_swap(char *buf,int len)

{
  char cVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  char cVar4;
  char tmp;
  
  if (len == 8) {
    *(ulong *)buf = CONCAT44((int)*(undefined8 *)buf,(int)((ulong)*(undefined8 *)buf >> 0x20));
    byte_swap(buf + 4,4);
  }
  else if (len != 4) {
    if (len != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                    ,0x70a,"void byte_swap(char *, int)");
    }
    cVar4 = buf[1];
    goto LAB_00105d11;
  }
  uVar2 = *(undefined2 *)buf;
  uVar3 = *(undefined2 *)(buf + 2);
  *(undefined2 *)buf = uVar3;
  buf[2] = (char)((ushort)uVar2 >> 8);
  buf[3] = (char)uVar2;
  cVar4 = (char)((ushort)uVar3 >> 8);
LAB_00105d11:
  cVar1 = *buf;
  *buf = cVar4;
  buf[1] = cVar1;
  return;
}

Assistant:

static void
byte_swap(char *buf, int len)
{
    switch(len) {
    case 8: {
	int4 tmp;
	tmp = ((int4*) buf)[0];
	((int4*)buf)[0] = ((int4*) buf)[1];
	((int4*) buf)[1] = tmp;
	byte_swap(buf + 4, 4);
	/* falling through */
    }
    case 4: {
	int2 tmp;
	tmp = ((int2*) buf)[0];
	((int2*)buf)[0] = ((int2*) buf)[1];
	((int2*) buf)[1] = tmp;
	byte_swap(buf + 2, 2);
	/* falling through */
    }
    case 2: {
	char tmp;
	tmp = buf[0];
	buf[0] = buf[1];
	buf[1] = tmp;
	break;
    }
    default:
	assert(0);
    }
}